

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-color.c
# Opt level: O0

uint8_t get_color(uint8_t a,int attr,int n)

{
  int local_14;
  int n_local;
  int attr_local;
  uint8_t a_local;
  
  n_local._3_1_ = a;
  if (((a & 0x80) == 0) && (local_14 = n, n_local._2_1_ = a, attr != 0)) {
    for (; 0 < local_14; local_14 = local_14 + -1) {
      n_local._2_1_ = *(byte *)((ulong)n_local._2_1_ * 0x2a + 0x302131 + (long)attr);
    }
    n_local._3_1_ = n_local._2_1_;
  }
  return n_local._3_1_;
}

Assistant:

uint8_t get_color(uint8_t a, int attr, int n)
{
	/* Accept any graphical attr (high bit set) */
	if (a & (0x80))
		return (a);

	/* TODO: Honour the attribute for the term (full color, mono, 16 color) */
	if (!attr)
		return (a);

	/* Translate the color N times */
	while (n > 0) {
		a = color_table[a].color_translate[attr];
		n--;
	}

	/* Return the modified color */
	return (a);
}